

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3WhereClauseClear(WhereClause *pWC)

{
  sqlite3 *db;
  WhereOrInfo *pWC_00;
  ushort uVar1;
  uint uVar2;
  anon_union_8_3_737c4e49_for_u *paVar3;
  WhereTerm *p;
  
  db = pWC->pWInfo->pParse->db;
  p = pWC->a;
  if (0 < pWC->nTerm) {
    uVar2 = pWC->nTerm + 1;
    paVar3 = &p->u;
    do {
      uVar1 = *(u16 *)((long)paVar3 + -0x16);
      if (((uVar1 & 1) != 0) && (((WhereTerm *)(paVar3 + -5))->pExpr != (Expr *)0x0)) {
        sqlite3ExprDeleteNN(db,((WhereTerm *)(paVar3 + -5))->pExpr);
        uVar1 = *(u16 *)((long)paVar3 + -0x16);
      }
      if (((uVar1 & 0x10) != 0) || ((uVar1 & 0x20) != 0)) {
        pWC_00 = paVar3->pOrInfo;
        sqlite3WhereClauseClear(&pWC_00->wc);
        if (pWC_00 != (WhereOrInfo *)0x0) {
          sqlite3DbFreeNN(db,pWC_00);
        }
      }
      uVar2 = uVar2 - 1;
      paVar3 = paVar3 + 8;
    } while (1 < uVar2);
    p = pWC->a;
  }
  if (p == (WhereTerm *)0x0 || p == pWC->aStatic) {
    return;
  }
  sqlite3DbFreeNN(db,p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereClauseClear(WhereClause *pWC){
  int i;
  WhereTerm *a;
  sqlite3 *db = pWC->pWInfo->pParse->db;
  for(i=pWC->nTerm-1, a=pWC->a; i>=0; i--, a++){
    if( a->wtFlags & TERM_DYNAMIC ){
      sqlite3ExprDelete(db, a->pExpr);
    }
    if( a->wtFlags & TERM_ORINFO ){
      whereOrInfoDelete(db, a->u.pOrInfo);
    }else if( a->wtFlags & TERM_ANDINFO ){
      whereAndInfoDelete(db, a->u.pAndInfo);
    }
  }
  if( pWC->a!=pWC->aStatic ){
    sqlite3DbFree(db, pWC->a);
  }
}